

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

void __thiscall
expression_tree::
cache_on_evaluation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::sequential>
::branch::~branch(branch *this)

{
  branch *this_local;
  
  (this->super_default_branch_t).
  super_node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_node_impl = (_func_int **)&PTR__branch_002bd548;
  std::__cxx11::string::~string((string *)&this->value);
  detail::
  default_branch<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  ::~default_branch(&this->super_default_branch_t);
  return;
}

Assistant:

virtual ~branch() {}